

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::PipelineTask::ExecuteTask(PipelineTask *this,TaskExecutionMode mode)

{
  unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true> *this_00
  ;
  _Atomic_word *p_Var1;
  atomic<unsigned_long> *paVar2;
  __int_type _Var3;
  Pipeline *pipeline_p;
  ClientContext *context_p;
  __int_type _Var4;
  int iVar5;
  PipelineExecuteResult PVar6;
  PipelineExecutor *this_01;
  pointer pPVar7;
  Event *this_02;
  InternalException *this_03;
  weak_ptr<duckdb::Task,_true> local_60;
  string local_50;
  
  this_00 = &this->pipeline_executor;
  if ((this->pipeline_executor).
      super_unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PipelineExecutor_*,_std::default_delete<duckdb::PipelineExecutor>_>
      .super__Head_base<0UL,_duckdb::PipelineExecutor_*,_false>._M_head_impl ==
      (PipelineExecutor *)0x0) {
    pipeline_p = this->pipeline;
    context_p = pipeline_p->executor->context;
    this_01 = (PipelineExecutor *)operator_new(0x200);
    PipelineExecutor::PipelineExecutor(this_01,context_p,pipeline_p);
    ::std::__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
    ::reset((__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
             *)this_00,this_01);
  }
  pPVar7 = unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
           ::operator->(this_00);
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&local_50);
  local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50._M_dataplus._M_p;
  local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_50._M_string_length + 0xc) =
           *(_Atomic_word *)(local_50._M_string_length + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_50._M_string_length + 0xc) =
           *(_Atomic_word *)(local_50._M_string_length + 0xc) + 1;
    }
  }
  PipelineExecutor::SetTaskForInterrupts(pPVar7,&local_60);
  if (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(local_60.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
  }
  pPVar7 = unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
           ::operator->(this_00);
  if (mode == PROCESS_PARTIAL) {
    PVar6 = PipelineExecutor::Execute(pPVar7,0x32);
    if (PVar6 == NOT_FINISHED) {
      return TASK_NOT_FINISHED;
    }
    if (PVar6 == INTERRUPTED) {
      return TASK_BLOCKED;
    }
  }
  else {
    PVar6 = PipelineExecutor::Execute(pPVar7,0xffffffffffffffff);
    if (PVar6 == INTERRUPTED) {
      return TASK_BLOCKED;
    }
    if (PVar6 == NOT_FINISHED) {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Execute without limit should not return NOT_FINISHED","");
      InternalException::InternalException(this_03,&local_50);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_02 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  _Var4 = (this_02->total_tasks).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  paVar2 = &this_02->finished_tasks;
  _Var3 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var3 + 1 == _Var4) {
    Event::Finish(this_02);
  }
  ::std::__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>::
  reset((__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_> *
        )this_00,(pointer)0x0);
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult PipelineTask::ExecuteTask(TaskExecutionMode mode) {
	if (!pipeline_executor) {
		pipeline_executor = make_uniq<PipelineExecutor>(pipeline.GetClientContext(), pipeline);
	}

	pipeline_executor->SetTaskForInterrupts(shared_from_this());

	if (mode == TaskExecutionMode::PROCESS_PARTIAL) {
		auto res = pipeline_executor->Execute(PARTIAL_CHUNK_COUNT);

		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			return TaskExecutionResult::TASK_NOT_FINISHED;
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	} else {
		auto res = pipeline_executor->Execute();
		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			throw InternalException("Execute without limit should not return NOT_FINISHED");
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	}

	event->FinishTask();
	pipeline_executor.reset();
	return TaskExecutionResult::TASK_FINISHED;
}